

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::Type::coerceValue(Type *this,ConstantValue *value)

{
  bool bVar1;
  bitwidth_t bVar2;
  Type *in_RDX;
  ConstantValue *in_RDI;
  Type *in_stack_00000018;
  bool in_stack_000000e2;
  bool in_stack_000000e3;
  bitwidth_t in_stack_000000e4;
  ConstantValue *in_stack_000000e8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  Type *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  bVar1 = isIntegral(in_stack_ffffffffffffffc0);
  if (bVar1) {
    getBitWidth((Type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    isSigned(in_RDX);
    isFourState(in_stack_00000018);
    slang::ConstantValue::convertToInt
              (in_stack_000000e8,in_stack_000000e4,in_stack_000000e3,in_stack_000000e2);
  }
  else {
    bVar1 = isFloating((Type *)0xa10ab6);
    if (bVar1) {
      bVar2 = getBitWidth((Type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (bVar2 == 0x20) {
        slang::ConstantValue::convertToShortReal((ConstantValue *)in_RDX);
      }
      else {
        slang::ConstantValue::convertToReal((ConstantValue *)in_RDX);
      }
    }
    else {
      bVar1 = isString((Type *)0xa10af7);
      if (bVar1) {
        slang::ConstantValue::convertToStr((ConstantValue *)this);
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_ffffffffffffffc0,
                   (nullptr_t)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      }
    }
  }
  return in_RDI;
}

Assistant:

ConstantValue Type::coerceValue(const ConstantValue& value) const {
    if (isIntegral())
        return value.convertToInt(getBitWidth(), isSigned(), isFourState());

    if (isFloating()) {
        if (getBitWidth() == 32)
            return value.convertToShortReal();
        else
            return value.convertToReal();
    }

    if (isString())
        return value.convertToStr();

    return nullptr;
}